

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_list2(lyd_node *parent,lys_module *module,char *name,char *keys,uint32_t options,
                    lyd_node **node)

{
  ly_ctx *plVar1;
  LY_ERR LVar2;
  lys_module *plVar3;
  size_t sVar4;
  lysc_node *plVar5;
  char *pcVar6;
  ly_ctx *ctx;
  lyd_node *ret;
  lysc_ext_instance *ext;
  lysc_node *schema;
  size_t local_40;
  char *local_38;
  
  ret = (lyd_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  if (parent == (lyd_node *)0x0) {
    plVar3 = module;
    if (module != (lys_module *)0x0) goto LAB_0012c403;
    ctx = (ly_ctx *)0x0;
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      plVar3 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar3 = parent->schema->module;
    }
LAB_0012c403:
    ctx = plVar3->ctx;
  }
  if (parent == (lyd_node *)0x0 && module == (lys_module *)0x0) {
    pcVar6 = "parent || module";
  }
  else if (parent == (lyd_node *)0x0 && node == (lyd_node **)0x0) {
    pcVar6 = "parent || node";
  }
  else {
    if (name != (char *)0x0) {
      if (parent != (lyd_node *)0x0) {
        plVar5 = parent->schema;
        if (plVar5 == (lysc_node *)0x0) {
          if (module == (lys_module *)0x0) goto LAB_0012c4de;
          plVar1 = (ly_ctx *)parent[2].schema;
        }
        else {
          if (module == (lys_module *)0x0) goto LAB_0012c4de;
          plVar1 = plVar5->module->ctx;
        }
        if ((plVar1 != (ly_ctx *)0x0) && (module->ctx != (ly_ctx *)0x0)) {
          if (plVar5 == (lysc_node *)0x0) {
            plVar3 = (lys_module *)&parent[2].schema;
          }
          else {
            plVar3 = plVar5->module;
          }
          if (plVar3->ctx != module->ctx) {
            if (plVar5 == (lysc_node *)0x0) {
              plVar3 = (lys_module *)&parent[2].schema;
            }
            else {
              plVar3 = plVar5->module;
            }
            ly_log(plVar3->ctx,LY_LLERR,LY_EINVAL,
                   "Different contexts mixed in a single function call.");
            return LY_EINVAL;
          }
        }
      }
LAB_0012c4de:
      if (module == (lys_module *)0x0) {
        module = parent->schema->module;
      }
      local_38 = "";
      if (keys != (char *)0x0) {
        local_38 = keys;
      }
      if (parent == (lyd_node *)0x0) {
        plVar5 = (lysc_node *)0x0;
      }
      else {
        plVar5 = parent->schema;
      }
      schema = lys_find_child(plVar5,module,name,0,0x10,(options & 1) << 4);
      if ((parent != (lyd_node *)0x0) && (schema == (lysc_node *)0x0)) {
        pcVar6 = module->name;
        local_40 = strlen(pcVar6);
        sVar4 = strlen(name);
        LVar2 = ly_nested_ext_schema
                          (parent,(lysc_node *)0x0,pcVar6,local_40,LY_VALUE_JSON,(void *)0x0,name,
                           sVar4,&schema,&ext);
        if ((LVar2 != LY_ENOT) && (LVar2 != LY_SUCCESS)) {
          return LVar2;
        }
      }
      pcVar6 = local_38;
      plVar5 = schema;
      if (schema == (lysc_node *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"List node \"%s\" not found.",name);
        return LY_ENOTFOUND;
      }
      if (((schema->flags & 0x200) == 0) || (*local_38 != '\0')) {
        sVar4 = strlen(local_38);
        LVar2 = lyd_create_list2(plVar5,pcVar6,sVar4,(byte)(options >> 1) & 1,&ret);
      }
      else {
        LVar2 = lyd_create_inner(schema,&ret);
      }
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (ext != (lysc_ext_instance *)0x0) {
        ret->flags = ret->flags | 8;
      }
      if (parent != (lyd_node *)0x0) {
        lyd_insert_node(parent,(lyd_node **)0x0,ret,0);
      }
      if (node == (lyd_node **)0x0) {
        return LY_SUCCESS;
      }
      *node = ret;
      return LY_SUCCESS;
    }
    pcVar6 = "name";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar6,"lyd_new_list2");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_list2(struct lyd_node *parent, const struct lys_module *module, const char *name, const char *keys,
        uint32_t options, struct lyd_node **node)
{
    LY_ERR r;
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct lysc_ext_instance *ext = NULL;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);
    uint32_t getnext_opts = (options & LYD_NEW_VAL_OUTPUT) ? LYS_GETNEXT_OUTPUT : 0;

    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);

    if (!module) {
        module = parent->schema->module;
    }
    if (!keys) {
        keys = "";
    }

    /* find schema node */
    schema = lys_find_child(parent ? parent->schema : NULL, module, name, 0, LYS_LIST, getnext_opts);
    if (!schema && parent) {
        r = ly_nested_ext_schema(parent, NULL, module->name, strlen(module->name), LY_VALUE_JSON, NULL, name, strlen(name),
                &schema, &ext);
        LY_CHECK_RET(r && (r != LY_ENOT), r);
    }
    LY_CHECK_ERR_RET(!schema, LOGERR(ctx, LY_EINVAL, "List node \"%s\" not found.", name), LY_ENOTFOUND);

    if ((schema->flags & LYS_KEYLESS) && !keys[0]) {
        /* key-less list */
        LY_CHECK_RET(lyd_create_inner(schema, &ret));
    } else {
        /* create the list node */
        ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;

        LY_CHECK_RET(lyd_create_list2(schema, keys, strlen(keys), store_only, &ret));
    }
    if (ext) {
        ret->flags |= LYD_EXT;
    }
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}